

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O2

void __thiscall GenericModelItem::removeRows(GenericModelItem *this,int row,int count)

{
  QVector<GenericModelItem_*> *this_00;
  int iVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  
  if (0 < this->m_colCount) {
    this_00 = &this->children;
    iVar3 = QList<GenericModelItem_*>::begin(this_00);
    iVar1 = this->m_colCount;
    iVar4 = QList<GenericModelItem_*>::begin(this_00);
    iVar2 = this->m_colCount;
    iVar5 = QList<GenericModelItem_*>::end(this_00);
    iVar3.i = iVar3.i + (long)(count + row) * (long)iVar1;
    for (iVar6.i = iVar3.i; iVar6.i != iVar5.i; iVar6.i = iVar6.i + 1) {
      (*iVar6.i)->m_row = (*iVar6.i)->m_row - count;
    }
    qDeleteAll<QList<GenericModelItem*>::iterator>
              ((iterator)(iVar4.i + (long)row * (long)iVar2),iVar3);
    QList<GenericModelItem_*>::erase
              (this_00,(const_iterator)(iVar4.i + (long)row * (long)iVar2),(const_iterator)iVar3.i);
  }
  this->m_rowCount = this->m_rowCount - count;
  return;
}

Assistant:

void GenericModelItem::removeRows(int row, int count)
{
    if (m_colCount > 0) {
        Q_ASSERT((row + count) * m_colCount <= children.size());
        const auto endRemoveIter = children.begin() + ((row + count) * m_colCount);
        const auto startRemoveIter = children.begin() + (row * m_colCount);
        for (auto i = endRemoveIter, iEnd = children.end(); i != iEnd; ++i)
            (*i)->m_row -= count;
        qDeleteAll(startRemoveIter, endRemoveIter);
        children.erase(startRemoveIter, endRemoveIter);
    }
    m_rowCount -= count;
#ifdef QT_DEBUG
    Q_ASSERT(m_colCount * m_rowCount == children.size());
    for (int i = 0; i < children.size(); ++i) {
        Q_ASSERT(children.at(i)->row() == i / m_colCount);
        Q_ASSERT(children.at(i)->column() == i % m_colCount);
    }
#endif
}